

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::PipelineCache>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 dVar1;
  Resources *ptr;
  CreateThread<vkt::api::(anonymous_namespace)::PipelineCache> *this;
  allocator_type *__a;
  ulong __n;
  pointer this_00;
  bool bVar2;
  Parameters local_d1;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_d0;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  resources;
  ThreadGroup threads;
  SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources> local_78;
  Environment env;
  
  dVar1 = getDefaultTestThreadCount();
  Environment::Environment(&env,context,1);
  __n = (ulong)dVar1;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  ::vector(&resources,__n,__a);
  ThreadGroup::ThreadGroup(&threads);
  this_00 = resources.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (bVar2 = __n != 0, __n = __n - 1, bVar2) {
    ptr = (Resources *)operator_new(1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>::SharedPtr
              (&local_78,ptr);
    de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>::operator=
              (this_00,&local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>::release(&local_78);
    this = (CreateThread<vkt::api::(anonymous_namespace)::PipelineCache> *)operator_new(0x88);
    CreateThread<vkt::api::(anonymous_namespace)::PipelineCache>::CreateThread
              (this,&env,this_00->m_ptr,&local_d1);
    local_d0.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this;
    ThreadGroup::add(&threads,&local_d0);
    if ((CreateThread<vkt::api::(anonymous_namespace)::PipelineCache> *)
        local_d0.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::PipelineCache> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_d0.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_d0.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    this_00 = this_00 + 1;
  }
  ThreadGroup::run(__return_storage_ptr__,&threads);
  ThreadGroup::~ThreadGroup(&threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::PipelineCache::Resources>_>_>
  ::~vector(&resources);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}